

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_tests.cpp
# Opt level: O2

void settings_tests::NullOverride_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_wrap_stringstream<char> *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  pointer local_698;
  pointer local_690;
  char *local_688;
  char *local_680;
  pointer local_678;
  pointer local_670;
  char *local_668;
  char *local_660;
  pointer local_658;
  pointer local_650;
  char *local_648;
  char *local_640;
  pointer local_638;
  pointer local_630;
  char *local_628;
  char *local_620;
  pointer local_618;
  pointer local_610;
  char *local_608;
  char *local_600;
  basic_wrap_stringstream<char> local_5f8;
  NullOverride t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_600 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"NullOverride");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_618 = (pbVar3->_M_dataplus)._M_p;
  local_610 = local_618 + pbVar3->_M_string_length;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x91;
  file.m_begin = (iterator)&local_608;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_618,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  NullOverride::NullOverride(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_620 = "";
  memset(&local_5f8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f8);
  std::operator<<((ostream *)&local_5f8,'\"');
  std::operator<<((ostream *)&local_5f8,"NullOverride");
  std::operator<<((ostream *)&local_5f8,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f8);
  local_638 = (pbVar3->_M_dataplus)._M_p;
  local_630 = local_638 + pbVar3->_M_string_length;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x91;
  file_00.m_begin = (iterator)&local_628;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_638,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_5f8);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_640 = "";
  memset(&local_5f8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f8);
  std::operator<<((ostream *)&local_5f8,'\"');
  std::operator<<((ostream *)&local_5f8,"NullOverride");
  std::operator<<((ostream *)&local_5f8,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f8);
  local_658 = (pbVar3->_M_dataplus)._M_p;
  local_650 = local_658 + pbVar3->_M_string_length;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0x91;
  file_01.m_begin = (iterator)&local_648;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_658,msg_01);
  this = &local_5f8;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  NullOverride::test_method((NullOverride *)this);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_660 = "";
  memset(&local_5f8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f8);
  std::operator<<((ostream *)&local_5f8,'\"');
  std::operator<<((ostream *)&local_5f8,"NullOverride");
  std::operator<<((ostream *)&local_5f8,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f8);
  local_678 = (pbVar3->_M_dataplus)._M_p;
  local_670 = local_678 + pbVar3->_M_string_length;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = (iterator)0x91;
  file_02.m_begin = (iterator)&local_668;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_678,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_5f8);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/settings_tests.cpp"
  ;
  local_680 = "";
  memset(&local_5f8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_5f8);
  std::operator<<((ostream *)&local_5f8,'\"');
  std::operator<<((ostream *)&local_5f8,"NullOverride");
  std::operator<<((ostream *)&local_5f8,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_5f8);
  local_698 = (pbVar3->_M_dataplus)._M_p;
  local_690 = local_698 + pbVar3->_M_string_length;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  file_03.m_end = (iterator)0x91;
  file_03.m_begin = (iterator)&local_688;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_698,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_5f8);
  BasicTestingSetup::~BasicTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(NullOverride)
{
    common::Settings settings;
    settings.command_line_options["name"].emplace_back("value");
    BOOST_CHECK_EQUAL(R"("value")", GetSetting(settings, "section", "name", false, false, false).write().c_str());
    settings.forced_settings["name"] = {};
    BOOST_CHECK_EQUAL(R"(null)", GetSetting(settings, "section", "name", false, false, false).write().c_str());
}